

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

Aig_Man_t * Saig_ManRetimeDupBackward(Aig_Man_t *p,Vec_Ptr_t *vCut,Vec_Int_t *vInit)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Man_t *p_01;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  int local_dc;
  int local_6c;
  int local_44;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Int_t *vInit_local;
  Vec_Ptr_t *vCut_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_01 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar2;
  iVar1 = Vec_PtrSize(vCut);
  p_01->nRegs = iVar1;
  p_01->nTruePis = p->nTruePis;
  p_01->nTruePos = p->nTruePos;
  Aig_ManCleanData(p);
  pAVar3 = Aig_ManConst1(p_01);
  pAVar4 = Aig_ManConst1(p);
  (pAVar4->field_5).pData = pAVar3;
  for (local_44 = 0; iVar1 = Saig_ManPiNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,local_44);
    pAVar3 = Aig_ObjCreateCi(p_01);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(vCut), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar5 = Vec_PtrEntry(vCut,local_44);
    pAVar3 = Aig_ObjCreateCi(p_01);
    if (vInit == (Vec_Int_t *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = Vec_IntEntry(vInit,local_44);
    }
    pAVar3 = Aig_NotCond(pAVar3,local_6c);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_44 = 0; iVar1 = Saig_ManRegNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_44 + iVar1);
    pAVar4 = Aig_ObjFanin0(pAVar3);
    Saig_ManRetimeDup_rec(p_01,pAVar4);
    pAVar4 = Aig_ObjChild0Copy(pAVar3);
    (pAVar3->field_5).pData = pAVar4;
  }
  for (local_44 = 0; iVar1 = Saig_ManRegNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Saig_ManLi(p,local_44);
    pAVar4 = Saig_ManLo(p,local_44);
    pAVar4->field_5 = pAVar3->field_5;
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(vCut), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vCut,local_44);
    iVar1 = Aig_ObjIsNode(pAVar3);
    if (iVar1 != 0) {
      (pAVar3->field_5).pData = (void *)0x0;
    }
  }
  pAVar3 = Aig_ManConst1(p);
  pAVar4 = Aig_ManConst1(p_01);
  (pAVar3->field_5).pData = pAVar4;
  for (local_44 = 0; iVar1 = Saig_ManPiNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,local_44);
    pAVar3 = Aig_ManCi(p_01,local_44);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_44 = 0; iVar1 = Saig_ManPoNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_44);
    pAVar4 = Aig_ObjFanin0(pAVar3);
    Saig_ManRetimeDup_rec(p_01,pAVar4);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo(p_01,pAVar3);
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(vCut), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vCut,local_44);
    Saig_ManRetimeDup_rec(p_01,pAVar3);
    pAVar3 = (Aig_Obj_t *)(pAVar3->field_5).pData;
    if (vInit == (Vec_Int_t *)0x0) {
      local_dc = 0;
    }
    else {
      local_dc = Vec_IntEntry(vInit,local_44);
    }
    pAVar3 = Aig_NotCond(pAVar3,local_dc);
    Aig_ObjCreateCo(p_01,pAVar3);
  }
  Aig_ManCleanup(p_01);
  return p_01;
}

Assistant:

Aig_Man_t * Saig_ManRetimeDupBackward( Aig_Man_t * p, Vec_Ptr_t * vCut, Vec_Int_t * vInit )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    // mark the cones under the cut
//    assert( Vec_PtrSize(vCut) == Saig_ManRetimeCountCut(p, vCut) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nRegs = Vec_PtrSize(vCut);
    pNew->nTruePis = p->nTruePis;
    pNew->nTruePos = p->nTruePos;
    // create the true PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the registers
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ObjCreateCi(pNew), vInit?Vec_IntEntry(vInit,i):0 );
    // duplicate logic above the cut and remember values
    Saig_ManForEachLi( p, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
        pObj->pData = Aig_ObjChild0Copy(pObj);
    }
    // transfer values from the LIs to the LOs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLo->pData = pObjLi->pData;
    // erase the data values on the internal nodes of the cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = NULL;
    // replicate the data on the constant node and the PIs
    pObj = Aig_ManConst1(p);
    pObj->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // duplicate logic below the cut
    Saig_ManForEachPo( p, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, pObj );
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)pObj->pData, vInit?Vec_IntEntry(vInit,i):0) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}